

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QAccessibleInterface*(*)(QString_const&,QObject*)>::
emplace<QAccessibleInterface*(*&)(QString_const&,QObject*)>
          (QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *this,qsizetype i,
          _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **pp_Var3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *in_RDI;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **where;
  GrowthPosition pos;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr *tmp;
  bool detach;
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr *p_Var5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::needsDetach
                    (in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::
                freeSpaceAtEnd(in_stack_ffffffffffffffc8), qVar2 != 0)) {
      pp_Var3 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::end
                          (in_RDI);
      *pp_Var3 = (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::
                freeSpaceAtBegin(in_stack_ffffffffffffffc8), qVar2 != 0)) {
      pp_Var3 = QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::begin
                          ((QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>
                            *)0x95e927);
      pp_Var3[-1] = (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  p_Var5 = (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::detachAndGrow
            ((QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(GrowthPosition)((ulong)p_Var5 >> 0x20),
             CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr ***)in_stack_ffffffffffffffc8,
             in_RDI);
  pp_Var3 = QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::createHole
                      ((QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)p_Var5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *pp_Var3 = p_Var5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }